

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::FinalPass(cmMakefile *this)

{
  bool bVar1;
  reference ppcVar2;
  cmCommand *fpCommand;
  iterator __end1;
  iterator __begin1;
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> *__range1;
  cmMakefile *this_local;
  
  ExpandVariablesCMP0019(this);
  __end1 = std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::begin(&this->FinalPassCommands);
  fpCommand = (cmCommand *)
              std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::end(&this->FinalPassCommands);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmCommand_**,_std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>_>
                                *)&fpCommand);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmCommand_**,_std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>_>
              ::operator*(&__end1);
    (*(*ppcVar2)->_vptr_cmCommand[4])();
    __gnu_cxx::
    __normal_iterator<cmCommand_**,_std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>_>::
    operator++(&__end1);
  }
  cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,(anonymous_namespace)::file_not_persistent>
            (&this->OutputFiles);
  cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,(anonymous_namespace)::file_not_persistent>
            (&this->ListFiles);
  return;
}

Assistant:

void cmMakefile::FinalPass()
{
  // do all the variable expansions here
  this->ExpandVariablesCMP0019();

  // give all the commands a chance to do something
  // after the file has been parsed before generation
  for (cmCommand* fpCommand : this->FinalPassCommands) {
    fpCommand->FinalPass();
  }

  // go through all configured files and see which ones still exist.
  // we don't want cmake to re-run if a configured file is created and deleted
  // during processing as that would make it a transient file that can't
  // influence the build process
  cmEraseIf(this->OutputFiles, file_not_persistent());

  // if a configured file is used as input for another configured file,
  // and then deleted it will show up in the input list files so we
  // need to scan those too
  cmEraseIf(this->ListFiles, file_not_persistent());
}